

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::JavascriptArray::ArrayElementEnumerator::Init(ArrayElementEnumerator *this,JavascriptArray *arr)

{
  uint uVar1;
  SparseArraySegmentBase *pSVar2;
  SparseArraySegmentBase *pSVar3;
  uint uVar4;
  
  if (arr == (JavascriptArray *)0x0) {
LAB_00b8342f:
    this->seg = (SparseArraySegmentBase *)0x0;
  }
  else {
    pSVar2 = GetBeginLookupSegment(arr,this->start,true);
    this->seg = pSVar2;
    if (pSVar2 != (SparseArraySegmentBase *)0x0) {
      do {
        uVar1 = pSVar2->left;
        if (this->start < pSVar2->length + uVar1) {
          uVar4 = this->end - uVar1;
          if (uVar1 <= this->end && uVar4 != 0) {
            pSVar3 = (SparseArraySegmentBase *)&this->start;
            if (this->start < uVar1) {
              pSVar3 = pSVar2;
            }
            this->index = ~uVar1 + pSVar3->left;
            uVar1 = pSVar2->length;
            if (uVar4 < pSVar2->length) {
              uVar1 = uVar4;
            }
            this->endIndex = uVar1;
            return;
          }
          goto LAB_00b8342f;
        }
        pSVar2 = (pSVar2->next).ptr;
        this->seg = pSVar2;
      } while (pSVar2 != (SparseArraySegmentBase *)0x0);
    }
  }
  return;
}

Assistant:

void JavascriptArray::ArrayElementEnumerator::Init(JavascriptArray* arr)
    {
        // Find start segment
        seg = (arr ? arr->GetBeginLookupSegment(start) : nullptr);
        while (seg && (seg->left + seg->length <= start))
        {
            seg = seg->next;
        }

        // Set start index and endIndex
        if (seg)
        {
            if (seg->left >= end)
            {
                seg = nullptr;
            }
            else
            {
                // set index to be at target index - 1, so MoveNext will move to target
                index = max(seg->left, start) - seg->left - 1;
                endIndex = min(end - seg->left, seg->length);
            }
        }
    }